

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::TraverseSchema::traverseComplexTypeDecl
          (TraverseSchema *this,DOMElement *elem,bool topLevel,XMLCh *recursingTypeName)

{
  XMLBuffer *this_00;
  XMLStringPool *pXVar1;
  Janitor<xercesc_4_0::XSAnnotation> annotation;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  XMLCh *pXVar8;
  XMLSize_t count;
  undefined4 extraout_var;
  XSDLocator *this_01;
  undefined4 extraout_var_00;
  DOMElement *pDVar9;
  DOMNode *node;
  XSAnnotation *pXVar10;
  XMLCh *pXVar11;
  undefined4 extraout_var_01;
  undefined4 uVar12;
  ComplexTypeInfo *local_78;
  XMLSize_t local_68;
  Janitor<xercesc_4_0::XSAnnotation> local_60;
  uint local_58;
  undefined4 local_54;
  XMLCh *local_50;
  ComplexTypeInfo *local_48;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  pXVar8 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  if ((pXVar8 == (XMLCh *)0x0) || (*pXVar8 == L'\0')) {
    if (!topLevel) {
      if (recursingTypeName == (XMLCh *)0x0) {
        pXVar8 = genAnonTypeName(this,(XMLCh *)fgAnonCNamePrefix);
        bVar3 = true;
      }
      else {
        bVar3 = false;
        pXVar8 = recursingTypeName;
      }
      goto LAB_00315a16;
    }
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0xe);
  }
  else {
    bVar3 = false;
LAB_00315a16:
    count = XMLString::stringLen(pXVar8);
    bVar2 = XMLChar1_0::isValidNCName(pXVar8,count);
    if (bVar2) {
      this_00 = &this->fBuffer;
      XMLBuffer::set(this_00,this->fTargetNSURIString);
      XMLBuffer::append(this_00,L',');
      XMLBuffer::append(this_00,pXVar8);
      pXVar1 = this->fStringPool;
      (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
      iVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])();
      iVar5 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])();
      pXVar11 = (XMLCh *)CONCAT44(extraout_var,iVar5);
      if ((recursingTypeName == (XMLCh *)0x0 && !topLevel) ||
         (local_78 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                               (this->fComplexTypeRegistry,pXVar11),
         local_78 == (ComplexTypeInfo *)0x0)) {
        GeneralAttributeCheck::checkAttributes
                  (&this->fAttributeCheck,elem,topLevel ^ 0xd,this,topLevel,this->fNonXSAttList);
        local_68 = this->fCircularCheckIndex;
        local_58 = this->fCurrentScope;
        local_78 = (ComplexTypeInfo *)XMemory::operator_new(0xb0,this->fGrammarPoolMemoryManager);
        ComplexTypeInfo::ComplexTypeInfo(local_78,this->fGrammarPoolMemoryManager);
        if (bVar3) {
          local_78->fAnonymous = true;
        }
        uVar6 = this->fScopeCount;
        this->fScopeCount = uVar6 + 1;
        this->fCurrentScope = uVar6;
        RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::put
                  (this->fComplexTypeRegistry,pXVar11,local_78);
        ComplexTypeInfo::setTypeName(local_78,pXVar11);
        local_78->fScopeDefined = this->fCurrentScope;
        if (this->fFullConstraintChecking == true) {
          this_01 = (XSDLocator *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
          XSDLocator::XSDLocator(this_01);
          pXVar1 = this->fStringPool;
          uVar6 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])
                            (pXVar1,this->fSchemaInfo->fCurrentSchemaURL);
          iVar5 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar6);
          XSDLocator::setValues
                    (this_01,(XMLCh *)CONCAT44(extraout_var_00,iVar5),(XMLCh *)0x0,
                     (XMLFileLoc)elem[0x16].super_DOMNode._vptr_DOMNode,
                     (XMLFileLoc)elem[0x17].super_DOMNode._vptr_DOMNode);
          ComplexTypeInfo::setLocator(local_78,this_01);
        }
        uVar12 = 0;
      }
      else {
        if (local_78->fPreprocessed == false) goto LAB_00315ef3;
        local_68 = this->fCircularCheckIndex;
        local_58 = this->fCurrentScope;
        this->fCurrentScope = local_78->fScopeDefined;
        local_78->fPreprocessed = false;
        uVar12 = (undefined4)CONCAT71((int7)((ulong)recursingTypeName >> 8),1);
      }
      local_60.fData._0_4_ = iVar4;
      ValueVectorOf<unsigned_int>::addElement(this->fCurrentTypeNameStack,(uint *)&local_60);
      local_48 = this->fCurrentComplexType;
      this->fCurrentComplexType = local_78;
      pDVar9 = XUtil::getFirstChildElement(&elem->super_DOMNode);
      node = &checkContent(this,elem,pDVar9,true,(bool)((byte)uVar12 ^ 1))->super_DOMNode;
      pXVar10 = this->fAnnotation;
      if ((pXVar10 == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
        if (this->fNonXSAttList->fCurCount == 0) {
          pXVar10 = (XSAnnotation *)0x0;
        }
        else {
          pXVar10 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
          this->fAnnotation = pXVar10;
        }
      }
      local_60.fData = pXVar10;
      local_54 = uVar12;
      local_50 = pXVar11;
      pXVar11 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_MIXED,Boolean);
      if (((pXVar11 == (XMLCh *)0x0) || (*pXVar11 == L'\0')) ||
         ((bVar3 = XMLString::equals((XMLCh *)SchemaSymbols::fgATTVAL_TRUE,pXVar11), !bVar3 &&
          (bVar3 = XMLString::equals(L"1",pXVar11), !bVar3)))) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
      }
      if (node == (DOMNode *)0x0) {
        processComplexContent(this,elem,pXVar8,(DOMElement *)0x0,local_78,(XMLCh *)0x0,bVar3,false);
      }
      else {
        iVar5 = (*node->_vptr_DOMNode[0x18])(node);
        bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar5),
                                  (XMLCh *)SchemaSymbols::fgELT_SIMPLECONTENT);
        if (bVar2) {
          traverseSimpleContentDecl(this,pXVar8,local_50,(DOMElement *)node,local_78,&local_60);
          pDVar9 = XUtil::getNextSiblingElement(node);
          if (pDVar9 != (DOMElement *)0x0) {
            iVar5 = 0x2d;
LAB_00315dd5:
            reportSchemaError(this,(DOMElement *)node,(XMLCh *)XMLUni::fgXMLErrDomain,iVar5);
          }
        }
        else {
          bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar5),
                                    (XMLCh *)SchemaSymbols::fgELT_COMPLEXCONTENT);
          if (bVar2) {
            traverseComplexContentDecl(this,pXVar8,(DOMElement *)node,local_78,bVar3,&local_60);
            pDVar9 = XUtil::getNextSiblingElement(node);
            if (pDVar9 != (DOMElement *)0x0) {
              iVar5 = 0x2e;
              goto LAB_00315dd5;
            }
          }
          else if (this->fCurrentGroupInfo == (XercesGroupInfo *)0x0) {
            processComplexContent
                      (this,elem,pXVar8,(DOMElement *)node,local_78,(XMLCh *)0x0,bVar3,false);
          }
          else {
            local_78->fPreprocessed = true;
          }
        }
      }
      if ((char)local_54 == '\0') {
        pXVar8 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_ABSTRACT,Boolean);
        iVar5 = parseBlockSet(this,elem,1,false);
        iVar7 = parseFinalSet(this,elem,3,false);
        local_78->fBlockSet = iVar5;
        local_78->fFinalSet = iVar7;
        if ((pXVar8 == (XMLCh *)0x0) || (*pXVar8 == L'\0')) {
LAB_00315ea7:
          bVar2 = false;
        }
        else {
          bVar3 = XMLString::equals(pXVar8,(XMLCh *)SchemaSymbols::fgATTVAL_TRUE);
          bVar2 = true;
          if ((!bVar3) && (bVar3 = XMLString::equals(pXVar8,L"1"), !bVar3)) goto LAB_00315ea7;
        }
        local_78->fAbstract = bVar2;
      }
      annotation.fData = local_60.fData;
      if (local_60.fData != (XSAnnotation *)0x0) {
        local_60.fData = (XSAnnotation *)0x0;
        SchemaGrammar::putAnnotation(this->fSchemaGrammar,local_78,annotation.fData);
      }
      popCurrentTypeNameStack(this);
      this->fCircularCheckIndex = local_68;
      this->fCurrentScope = local_58;
      this->fCurrentComplexType = local_48;
      goto LAB_00315ef3;
    }
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                      (XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  iVar4 = -1;
LAB_00315ef3:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return iVar4;
}

Assistant:

int TraverseSchema::traverseComplexTypeDecl(const DOMElement* const elem,
                                            const bool topLevel,
                                            const XMLCh* const recursingTypeName) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // Get the attributes of the complexType
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    bool isAnonymous = false;

    if (!name || !*name) {

        if (topLevel) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelNoNameComplexType);
            return -1;
        }

        if (recursingTypeName)
            name = recursingTypeName;
        else {
            name = genAnonTypeName(fgAnonCNamePrefix);
            isAnonymous = true;
        }
    }

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name)) ) {

        //REVISIT - Should we return or continue and save type with wrong name?
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_COMPLEXTYPE, name);
        return -1;
    }

    // ------------------------------------------------------------------
    // Check if the type has already been registered
    // ------------------------------------------------------------------
    fBuffer.set(fTargetNSURIString);
    fBuffer.append(chComma);
    fBuffer.append(name);

    int typeNameIndex = fStringPool->addOrFind(fBuffer.getRawBuffer());
    const XMLCh* fullName = fStringPool->getValueForId(typeNameIndex);
    ComplexTypeInfo* typeInfo = 0;

    if (topLevel || recursingTypeName) {

        typeInfo = fComplexTypeRegistry->get(fullName);

        if (typeInfo && !typeInfo->getPreprocessed()) {
            return typeNameIndex;
        }
    }

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    bool preProcessFlag = (typeInfo) ? typeInfo->getPreprocessed() : false;
    if (!preProcessFlag) {
        fAttributeCheck.checkAttributes(
            elem, (topLevel) ? GeneralAttributeCheck::E_ComplexTypeGlobal
                             : GeneralAttributeCheck::E_ComplexTypeLocal
            , this, topLevel, fNonXSAttList
        );
    }

    // -----------------------------------------------------------------------
    // Create a new instance
    // -----------------------------------------------------------------------
    XMLSize_t previousCircularCheckIndex = fCircularCheckIndex;
    unsigned int previousScope = fCurrentScope;

    if (preProcessFlag) {

        fCurrentScope = typeInfo->getScopeDefined();
        typeInfo->setPreprocessed(false);
    }
    else {

        // ------------------------------------------------------------------
        // Register the type
        // ------------------------------------------------------------------
        typeInfo = new (fGrammarPoolMemoryManager) ComplexTypeInfo(fGrammarPoolMemoryManager);
        if(isAnonymous) {
            typeInfo->setAnonymous();
        }

        fCurrentScope = fScopeCount++;
        fComplexTypeRegistry->put((void*) fullName, typeInfo);
        typeInfo->setTypeName(fullName);
        typeInfo->setScopeDefined(fCurrentScope);

        if (fFullConstraintChecking) {

            XSDLocator* aLocator = new (fGrammarPoolMemoryManager) XSDLocator();
            aLocator->setValues(fStringPool->getValueForId(fStringPool->addOrFind(fSchemaInfo->getCurrentSchemaURL())),
                                0, ((XSDElementNSImpl*) elem)->getLineNo(),
                                ((XSDElementNSImpl*) elem)->getColumnNo());
            typeInfo->setLocator(aLocator);
        }
    }

    fCurrentTypeNameStack->addElement(typeNameIndex);
    ComplexTypeInfo* saveTypeInfo = fCurrentComplexType;
    fCurrentComplexType = typeInfo;

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration and get next child
    // ------------------------------------------------------------------
    DOMElement* child = checkContent(elem, XUtil::getFirstChildElement(elem), true, !preProcessFlag);

    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // ------------------------------------------------------------------
    // Process the content of the complex type declaration
    // ------------------------------------------------------------------
    try {

        const XMLCh* mixedVal = getElementAttValue(elem,SchemaSymbols::fgATT_MIXED, DatatypeValidator::Boolean);
        bool isMixed = false;

        if ((mixedVal && *mixedVal)
            && (XMLString::equals(SchemaSymbols::fgATTVAL_TRUE, mixedVal)
                || XMLString::equals(fgValueOne, mixedVal))) {
            isMixed = true;
        }

        if (child == 0) {
            // EMPTY complexType with complexContent
            processComplexContent(elem, name, child, typeInfo, 0, isMixed);
        }
        else {

            const XMLCh* childName = child->getLocalName();

            if (XMLString::equals(childName, SchemaSymbols::fgELT_SIMPLECONTENT)) {

                // SIMPLE CONTENT element
                traverseSimpleContentDecl(name, fullName, child, typeInfo, &janAnnot);

                if (XUtil::getNextSiblingElement(child) != 0) {
                    reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildFollowingSimpleContent);
                }
            }
            else if (XMLString::equals(childName, SchemaSymbols::fgELT_COMPLEXCONTENT)) {

                // COMPLEX CONTENT element
                traverseComplexContentDecl(name, child, typeInfo, isMixed, &janAnnot);

                if (XUtil::getNextSiblingElement(child) != 0) {
                    reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildFollowingConplexContent);
                }
            }
            else if (fCurrentGroupInfo) {
                typeInfo->setPreprocessed(true);
            }
            else {
                // We must have ....
                // GROUP, ALL, SEQUENCE or CHOICE, followed by optional attributes
                // Note that it's possible that only attributes are specified.
                processComplexContent(elem, name, child, typeInfo, 0, isMixed);
            }
        }
    }
    catch(const TraverseSchema::ExceptionCodes aCode) {
        if (aCode == TraverseSchema::InvalidComplexTypeInfo)
            defaultComplexTypeInfo(typeInfo);
        else if (aCode == TraverseSchema::RecursingElement)
            typeInfo->setPreprocessed();
    }

    // ------------------------------------------------------------------
    // Finish the setup of the typeInfo
    // ------------------------------------------------------------------
    if (!preProcessFlag) {

        const XMLCh* abstractAttVal = getElementAttValue(elem, SchemaSymbols::fgATT_ABSTRACT, DatatypeValidator::Boolean);
        int blockSet = parseBlockSet(elem, C_Block);
        int finalSet = parseFinalSet(elem, EC_Final);

        typeInfo->setBlockSet(blockSet);
        typeInfo->setFinalSet(finalSet);

        if ((abstractAttVal && *abstractAttVal)
            && (XMLString::equals(abstractAttVal, SchemaSymbols::fgATTVAL_TRUE)
                || XMLString::equals(abstractAttVal, fgValueOne))) {
            typeInfo->setAbstract(true);
        }
        else {
            typeInfo->setAbstract(false);
        }
    }

    // Store Annotation
    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(typeInfo, janAnnot.release());

    // ------------------------------------------------------------------
    // Before exiting, restore the scope, mainly for nested anonymous types
    // ------------------------------------------------------------------
    popCurrentTypeNameStack();
    fCircularCheckIndex = previousCircularCheckIndex;
    fCurrentScope = previousScope;
    fCurrentComplexType = saveTypeInfo;

    return typeNameIndex;
}